

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_intlog.cpp
# Opt level: O1

void __thiscall
bitmanip::anon_unknown_0::Test_intlog_log10floor_manual_::run(Test_intlog_log10floor_manual_ *this)

{
  return;
}

Assistant:

BITMANIP_TEST(intlog, log10floor_manual)
{
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint8_t>(0u), 0u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint8_t>(9u), 0u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint8_t>(10u), 1u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint8_t>(99u), 1u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint8_t>(100u), 2u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint8_t>(255u), 2u);

    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(0u), 0u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(1u), 0u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(2u), 0u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(3u), 0u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(4u), 0u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(5u), 0u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(6u), 0u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(7u), 0u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(8u), 0u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(9u), 0u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(10u), 1u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(11u), 1u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(12u), 1u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(13u), 1u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(14u), 1u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(15u), 1u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(16u), 1u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(99u), 1u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(100u), 2u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(999u), 2u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(1'000u), 3u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(9'999u), 3u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(10000u), 4u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(99'999u), 4u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(100'000u), 5u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(999'999u), 5u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(1'000'000u), 6u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(9'999'999u), 6u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(10'000'000u), 7u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(99'999'999u), 7u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(100'000'000u), 8u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(999'999'999u), 8u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(1'000'000'000u), 9u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(2'000'000'000u), 9u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(4'000'000'000u), 9u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(std::uint32_t(~0)), 9u);

    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint64_t>(std::uint64_t{1} << 63), 18u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint64_t>(9'999'999'999'999'999'999ull), 18u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint64_t>(10'000'000'000'000'000'000ull), 19u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint64_t>(~std::uint64_t{0}), 19u);
}